

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

DWORD GetCurrentDirectoryW(DWORD nBufferLength,LPWSTR lpBuffer)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  int dir_len;
  char *current_dir;
  DWORD dwLastError;
  DWORD dwWideLen;
  LPWSTR lpBuffer_local;
  DWORD nBufferLength_local;
  
  current_dir._4_4_ = 0;
  current_dir._0_4_ = 0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  __s = PAL__getcwd((char *)0x0,0x401);
  if (__s == (char *)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    current_dir._0_4_ = DIRGetLastErrorFromErrno();
  }
  else {
    sVar2 = strlen(__s);
    current_dir._4_4_ = MultiByteToWideChar(0,0,__s,(int)sVar2,(LPWSTR)0x0,0);
    if (current_dir._4_4_ < nBufferLength) {
      iVar1 = MultiByteToWideChar(0,0,__s,(int)sVar2 + 1,lpBuffer,nBufferLength);
      if (iVar1 == 0) {
        fprintf(_stderr,"] %s %s:%d","GetCurrentDirectoryW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
                ,0x19d);
        fprintf(_stderr,"MultiByteToWideChar failure!\n");
        current_dir._4_4_ = 0;
        current_dir._0_4_ = 0x54f;
      }
    }
    else {
      current_dir._4_4_ = current_dir._4_4_ + 1;
    }
  }
  PAL_free(__s);
  if ((DWORD)current_dir != 0) {
    SetLastError((DWORD)current_dir);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return current_dir._4_4_;
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetCurrentDirectoryW(
             IN DWORD nBufferLength,
             OUT LPWSTR lpBuffer)
{
    DWORD dwWideLen = 0;
    DWORD dwLastError = 0;

    char  *current_dir;
    int   dir_len;

    PERF_ENTRY(GetCurrentDirectoryW);
    ENTRY("GetCurrentDirectoryW(nBufferLength=%u, lpBuffer=%p)\n",
          nBufferLength, lpBuffer);

    current_dir = PAL__getcwd( NULL, MAX_LONGPATH + 1 );

    if ( !current_dir )
    {
        WARN( "PAL__getcwd returned NULL\n" );
        dwLastError = DIRGetLastErrorFromErrno();
        goto done;
    }

    dir_len = strlen( current_dir );
    dwWideLen = MultiByteToWideChar( CP_ACP, 0,
                 current_dir, dir_len,
                 NULL, 0 );

    /* if the supplied buffer isn't long enough, return the required
       length, including room for the NULL terminator */
    if ( nBufferLength > dwWideLen )
    {
        if(!MultiByteToWideChar( CP_ACP, 0, current_dir, dir_len + 1,
                     lpBuffer, nBufferLength ))
        {
            ASSERT("MultiByteToWideChar failure!\n");
            dwWideLen = 0;
            dwLastError = ERROR_INTERNAL_ERROR;
        }
    }
    else
    {
        ++dwWideLen; /* include space for the NULL */
    }

done:
    PAL_free( current_dir );

    if ( dwLastError )
    {
        SetLastError(dwLastError);
    }

    LOGEXIT("GetCurrentDirectoryW returns DWORD %u\n", dwWideLen);
    PERF_EXIT(GetCurrentDirectoryW);
    return dwWideLen;
}